

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-parser.c++
# Opt level: O3

ModuleImpl * __thiscall
capnp::SchemaParser::getModuleImpl(SchemaParser *this,Own<capnp::SchemaFile> *file)

{
  __node_base *p_Var1;
  size_type *psVar2;
  Impl *this_00;
  anon_struct_8_0_00000001_for___align aVar3;
  long *plVar4;
  _Hash_node_base *p_Var5;
  __buckets_ptr pp_Var6;
  undefined8 *puVar7;
  long lVar8;
  ModuleImpl *pMVar9;
  __node_ptr p_Var10;
  SchemaFile *pSVar11;
  SchemaParser *pSVar12;
  char cVar13;
  int iVar14;
  __node_ptr __n;
  undefined4 extraout_var;
  __node_base_ptr *__s;
  __node_base_ptr *pp_Var15;
  undefined8 *puVar16;
  _Hash_node_base *p_Var17;
  ulong uVar18;
  size_type __n_00;
  ulong uVar19;
  __node_base_ptr p_Var20;
  _Hash_node_base _Var21;
  _Hash_node_base *p_Var22;
  __node_base_ptr p_Var23;
  undefined1 auVar24 [16];
  __buckets_alloc_type __alloc;
  new_allocator<std::__detail::_Hash_node_base_*> local_51;
  _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>_>_>
  *local_50;
  SchemaParser *local_48;
  size_t local_40;
  Own<capnp::SchemaFile> *local_38;
  
  this_00 = (this->impl).ptr;
  kj::_::Mutex::lock((Mutex *)this_00,EXCLUSIVE);
  aVar3 = (anon_struct_8_0_00000001_for___align)file->ptr;
  __n = (__node_ptr)operator_new(0x28);
  local_50 = (_Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>_>_>
              *)&(this_00->fileMap).value;
  (__n->super__Hash_node_base)._M_nxt = (_Hash_node_base *)0x0;
  (__n->
  super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
  ).
  super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
  ._M_storage._M_storage.__align = aVar3;
  *(undefined8 *)
   ((long)&(__n->
           super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
           ._M_storage._M_storage + 8) = 0;
  *(undefined8 *)
   ((long)&(__n->
           super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
           ._M_storage._M_storage + 0x10) = 0;
  local_48 = this;
  local_38 = file;
  iVar14 = (**(code **)(*(long *)aVar3 + 0x28))(aVar3);
  p_Var22 = (_Hash_node_base *)(ulong)(CONCAT44(extraout_var,iVar14) != 0);
  uVar18 = (ulong)p_Var22 % (this_00->fileMap).value._M_h._M_bucket_count;
  p_Var20 = (this_00->fileMap).value._M_h._M_buckets[uVar18 & 0xffffffff];
  if (p_Var20 != (__node_base_ptr)0x0) {
    p_Var17 = p_Var20->_M_nxt[4]._M_nxt;
    p_Var23 = p_Var20->_M_nxt;
    while ((p_Var17 != p_Var22 ||
           (plVar4 = *(long **)&(__n->
                                super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
                                ).
                                super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
                                ._M_storage._M_storage,
           cVar13 = (**(code **)(*plVar4 + 0x18))(plVar4,p_Var23[1]._M_nxt), cVar13 == '\0'))) {
      p_Var5 = p_Var23->_M_nxt;
      if ((p_Var5 == (_Hash_node_base *)0x0) ||
         (p_Var17 = p_Var5[4]._M_nxt, p_Var20 = p_Var23, p_Var23 = p_Var5,
         (ulong)p_Var17 % (this_00->fileMap).value._M_h._M_bucket_count != uVar18))
      goto LAB_0040ffa4;
    }
    p_Var10 = (__node_ptr)p_Var20->_M_nxt;
    if (p_Var10 != (__node_ptr)0x0) {
      std::__detail::
      _Hashtable_alloc<std::allocator<std::__detail::_Hash_node<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>_>_>
      ::_M_deallocate_node(local_50,__n);
      __n = p_Var10;
      goto LAB_00410160;
    }
  }
LAB_0040ffa4:
  local_40 = (this_00->fileMap).value._M_h._M_rehash_policy._M_next_resize;
  auVar24 = std::__detail::_Prime_rehash_policy::_M_need_rehash
                      ((ulong)&(this_00->fileMap).value._M_h._M_rehash_policy,
                       (this_00->fileMap).value._M_h._M_bucket_count,
                       (this_00->fileMap).value._M_h._M_element_count);
  __n_00 = auVar24._8_8_;
  if ((auVar24 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    __s = *(__node_base_ptr **)local_50;
  }
  else {
    if (__n_00 == 1) {
      __s = &(this_00->fileMap).value._M_h._M_single_bucket;
      (this_00->fileMap).value._M_h._M_single_bucket = (__node_base_ptr)0x0;
    }
    else {
      __s = __gnu_cxx::new_allocator<std::__detail::_Hash_node_base_*>::allocate
                      (&local_51,__n_00,(void *)0x0);
      memset(__s,0,__n_00 * 8);
    }
    _Var21._M_nxt = (this_00->fileMap).value._M_h._M_before_begin._M_nxt;
    (this_00->fileMap).value._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    if (_Var21._M_nxt != (_Hash_node_base *)0x0) {
      p_Var1 = &(this_00->fileMap).value._M_h._M_before_begin;
      uVar18 = 0;
      do {
        p_Var17 = (_Var21._M_nxt)->_M_nxt;
        uVar19 = (ulong)_Var21._M_nxt[4]._M_nxt % __n_00;
        if (__s[uVar19] == (_Hash_node_base *)0x0) {
          (_Var21._M_nxt)->_M_nxt = p_Var1->_M_nxt;
          p_Var1->_M_nxt = _Var21._M_nxt;
          __s[uVar19] = p_Var1;
          if ((_Var21._M_nxt)->_M_nxt != (_Hash_node_base *)0x0) {
            pp_Var15 = __s + uVar18;
            goto LAB_00410059;
          }
        }
        else {
          (_Var21._M_nxt)->_M_nxt = __s[uVar19]->_M_nxt;
          pp_Var15 = &__s[uVar19]->_M_nxt;
          uVar19 = uVar18;
LAB_00410059:
          *pp_Var15 = _Var21._M_nxt;
        }
        _Var21._M_nxt = p_Var17;
        uVar18 = uVar19;
      } while (p_Var17 != (_Hash_node_base *)0x0);
    }
    pp_Var6 = (this_00->fileMap).value._M_h._M_buckets;
    if (&(this_00->fileMap).value._M_h._M_single_bucket != pp_Var6) {
      operator_delete(pp_Var6,(this_00->fileMap).value._M_h._M_bucket_count << 3);
    }
    (this_00->fileMap).value._M_h._M_bucket_count = __n_00;
    (this_00->fileMap).value._M_h._M_buckets = __s;
    uVar18 = (ulong)p_Var22 % __n_00;
  }
  pSVar12 = local_48;
  (__n->
  super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
  ).super__Hash_node_code_cache<true>._M_hash_code = (size_t)p_Var22;
  if (__s[uVar18] == (_Hash_node_base *)0x0) {
    p_Var22 = (this_00->fileMap).value._M_h._M_before_begin._M_nxt;
    (__n->super__Hash_node_base)._M_nxt = p_Var22;
    (this_00->fileMap).value._M_h._M_before_begin._M_nxt = (_Hash_node_base *)__n;
    if (p_Var22 != (_Hash_node_base *)0x0) {
      __s[(ulong)p_Var22[4]._M_nxt % (this_00->fileMap).value._M_h._M_bucket_count] =
           (__node_base_ptr)__n;
      __s = (this_00->fileMap).value._M_h._M_buckets;
    }
    __s[uVar18] = &(this_00->fileMap).value._M_h._M_before_begin;
  }
  else {
    (__n->super__Hash_node_base)._M_nxt = __s[uVar18]->_M_nxt;
    __s[uVar18]->_M_nxt = (_Hash_node_base *)__n;
  }
  psVar2 = &(this_00->fileMap).value._M_h._M_element_count;
  *psVar2 = *psVar2 + 1;
  puVar16 = (undefined8 *)operator_new(0x58);
  *puVar16 = &PTR_addError_00626c88;
  puVar16[1] = pSVar12;
  pSVar11 = local_38->ptr;
  local_38->ptr = (SchemaFile *)0x0;
  puVar16[2] = local_38->disposer;
  puVar16[3] = pSVar11;
  *(undefined4 *)(puVar16 + 4) = 0;
  puVar16[9] = 0;
  puVar16[10] = 0;
  puVar7 = *(undefined8 **)
            ((long)&(__n->
                    super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
                    ._M_storage._M_storage + 8);
  lVar8 = *(long *)((long)&(__n->
                           super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
                           ).
                           super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
                           ._M_storage._M_storage + 0x10);
  *(undefined8 **)
   ((long)&(__n->
           super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
           ._M_storage._M_storage + 8) =
       &kj::_::HeapDisposer<capnp::SchemaParser::ModuleImpl>::instance;
  *(undefined8 **)
   ((long)&(__n->
           super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
           ).
           super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
           ._M_storage._M_storage + 0x10) = puVar16;
  if (lVar8 != 0) {
    (**(code **)*puVar7)();
  }
LAB_00410160:
  pMVar9 = *(ModuleImpl **)
            ((long)&(__n->
                    super__Hash_node_value<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>,_true>
                    ).
                    super__Hash_node_value_base<std::pair<const_capnp::SchemaFile_*const,_kj::Own<capnp::SchemaParser::ModuleImpl>_>_>
                    ._M_storage._M_storage + 0x10);
  kj::_::Mutex::unlock((Mutex *)this_00,EXCLUSIVE);
  return pMVar9;
}

Assistant:

SchemaParser::ModuleImpl& SchemaParser::getModuleImpl(kj::Own<SchemaFile>&& file) const {
  auto lock = impl->fileMap.lockExclusive();

  auto insertResult = lock->insert(std::make_pair(file.get(), kj::Own<ModuleImpl>()));
  if (insertResult.second) {
    // This is a newly-inserted entry.  Construct the ModuleImpl.
    insertResult.first->second = kj::heap<ModuleImpl>(*this, kj::mv(file));
  }
  return *insertResult.first->second;
}